

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int fts5CreateAux(fts5_api *pApi,char *zName,void *pUserData,fts5_extension_function xFunc,
                 _func_void_void_ptr *xDestroy)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  _func_int_fts5_api_ptr_char_ptr_void_ptr_ptr_fts5_tokenizer_ptr *__s;
  
  iVar1 = sqlite3_overload_function(*(sqlite3 **)(pApi + 1),zName,-1);
  if (iVar1 == 0) {
    sVar3 = strlen(zName);
    iVar2 = sqlite3_initialize();
    iVar1 = 7;
    if (iVar2 == 0) {
      __s = (_func_int_fts5_api_ptr_char_ptr_void_ptr_ptr_fts5_tokenizer_ptr *)
            sqlite3Malloc(sVar3 + 0x31);
      if (__s != (_func_int_fts5_api_ptr_char_ptr_void_ptr_ptr_fts5_tokenizer_ptr *)0x0) {
        iVar1 = 0;
        memset(__s,0,sVar3 + 0x31);
        *(_func_int_fts5_api_ptr_char_ptr_void_ptr_ptr_fts5_tokenizer_ptr **)(__s + 8) = __s + 0x30;
        memcpy(__s + 0x30,zName,sVar3 + 1);
        *(fts5_api **)__s = pApi;
        *(void **)(__s + 0x10) = pUserData;
        *(fts5_extension_function *)(__s + 0x18) = xFunc;
        *(_func_void_void_ptr **)(__s + 0x20) = xDestroy;
        *(_func_int_fts5_api_ptr_char_ptr_void_ptr_ptr_fts5_tokenizer_ptr **)(__s + 0x28) =
             pApi[1].xFindTokenizer;
        pApi[1].xFindTokenizer = __s;
      }
    }
  }
  return iVar1;
}

Assistant:

static int fts5CreateAux(
  fts5_api *pApi,                 /* Global context (one per db handle) */
  const char *zName,              /* Name of new function */
  void *pUserData,                /* User data for aux. function */
  fts5_extension_function xFunc,  /* Aux. function implementation */
  void(*xDestroy)(void*)          /* Destructor for pUserData */
){
  Fts5Global *pGlobal = (Fts5Global*)pApi;
  int rc = sqlite3_overload_function(pGlobal->db, zName, -1);
  if( rc==SQLITE_OK ){
    Fts5Auxiliary *pAux;
    sqlite3_int64 nName;            /* Size of zName in bytes, including \0 */
    sqlite3_int64 nByte;            /* Bytes of space to allocate */

    nName = strlen(zName) + 1;
    nByte = sizeof(Fts5Auxiliary) + nName;
    pAux = (Fts5Auxiliary*)sqlite3_malloc64(nByte);
    if( pAux ){
      memset(pAux, 0, (size_t)nByte);
      pAux->zFunc = (char*)&pAux[1];
      memcpy(pAux->zFunc, zName, nName);
      pAux->pGlobal = pGlobal;
      pAux->pUserData = pUserData;
      pAux->xFunc = xFunc;
      pAux->xDestroy = xDestroy;
      pAux->pNext = pGlobal->pAux;
      pGlobal->pAux = pAux;
    }else{
      rc = SQLITE_NOMEM;
    }
  }

  return rc;
}